

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

void __thiscall
caffe::DummyDataParameter::DummyDataParameter(DummyDataParameter *this,DummyDataParameter *from)

{
  void *pvVar1;
  
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__DummyDataParameter_00760710;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  .ptr_ = (void *)0x0;
  (this->_has_bits_).has_bits_[0] = (from->_has_bits_).has_bits_[0];
  this->_cached_size_ = 0;
  google::protobuf::RepeatedPtrField<caffe::FillerParameter>::RepeatedPtrField
            (&this->data_filler_,&from->data_filler_);
  google::protobuf::RepeatedField<unsigned_int>::RepeatedField(&this->num_,&from->num_);
  google::protobuf::RepeatedField<unsigned_int>::RepeatedField(&this->channels_,&from->channels_);
  google::protobuf::RepeatedField<unsigned_int>::RepeatedField(&this->height_,&from->height_);
  google::protobuf::RepeatedField<unsigned_int>::RepeatedField(&this->width_,&from->width_);
  google::protobuf::RepeatedPtrField<caffe::BlobShape>::RepeatedPtrField
            (&this->shape_,&from->shape_);
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  return;
}

Assistant:

DummyDataParameter::DummyDataParameter(const DummyDataParameter& from)
  : ::google::protobuf::Message(),
      _internal_metadata_(NULL),
      _has_bits_(from._has_bits_),
      _cached_size_(0),
      data_filler_(from.data_filler_),
      num_(from.num_),
      channels_(from.channels_),
      height_(from.height_),
      width_(from.width_),
      shape_(from.shape_) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  // @@protoc_insertion_point(copy_constructor:caffe.DummyDataParameter)
}